

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExportRef
BinaryenAddGlobalExport(BinaryenModuleRef module,char *internalName,char *externalName)

{
  Export *curr;
  IString *pIVar1;
  undefined1 in_CL;
  string_view sVar2;
  string_view sVar3;
  
  curr = (Export *)operator_new(0x30);
  pIVar1 = (IString *)strlen(externalName);
  sVar2._M_str = (char *)0x0;
  sVar2._M_len = (size_t)externalName;
  sVar2 = wasm::IString::interned(pIVar1,sVar2,(bool)in_CL);
  pIVar1 = (IString *)strlen(internalName);
  sVar3._M_str = (char *)0x0;
  sVar3._M_len = (size_t)internalName;
  sVar3 = wasm::IString::interned(pIVar1,sVar3,(bool)in_CL);
  (curr->name).super_IString.str = sVar2;
  curr->kind = Global;
  *(string_view *)
   &(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType> = sVar3;
  *(__index_type *)
   ((long)&(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
           super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) = '\0';
  wasm::Module::addExport(module,curr);
  return curr;
}

Assistant:

BinaryenExportRef BinaryenAddGlobalExport(BinaryenModuleRef module,
                                          const char* internalName,
                                          const char* externalName) {
  auto* ret = new Export(externalName, ExternalKind::Global, internalName);
  ((Module*)module)->addExport(ret);
  return ret;
}